

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_consecutive_gap.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  int iVar1;
  vector<int,_std::allocator<int>_> local_70;
  allocator<int> local_45;
  int local_44 [3];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> e1;
  
  e1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
  ._4_4_ = 0;
  local_44[0] = 1;
  local_44[1] = 10;
  local_44[2] = 5;
  local_38 = local_44;
  local_30 = 3;
  std::allocator<int>::allocator(&local_45);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_45);
  std::allocator<int>::~allocator(&local_45);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_70,(vector<int,_std::allocator<int>_> *)local_28);
  iVar1 = max_gap(&local_70);
  if (iVar1 == 5) {
    std::vector<int,_std::allocator<int>_>::~vector(&local_70);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
    return e1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_;
  }
  __assert_fail("max_gap(e1) == 5",
                "/workspace/llm4binary/github/license_c_cmakelists/lukasmartinelli[P]sharpen/challenges/array/max_consecutive_gap.cpp"
                ,0x16,"int main()");
}

Assistant:

int main() {
    std::vector<int> e1 = {1, 10, 5};
    assert(max_gap(e1) == 5);
}